

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::RecursiveUpdateTxState
          (CWallet *this,WalletBatch *batch,uint256 *tx_hash,TryUpdatingStateFn *try_updating_state)

{
  key_type *__k;
  _Rb_tree_header *p_Var1;
  TxUpdate TVar2;
  iterator iVar3;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var4;
  const_iterator cVar5;
  ulong uVar6;
  ulong uVar7;
  const_iterator iter;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<uint256>,_std::_Rb_tree_iterator<uint256>_> pVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar9;
  uint256 now;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> done;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> todo;
  undefined1 local_e8 [16];
  _Base_ptr local_d8;
  _Base_ptr p_Stack_d0;
  uint32_t local_c8;
  undefined1 local_b8 [16];
  _Base_ptr local_a8;
  _Base_ptr p_Stack_a0;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_98;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  long lStack_38;
  
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_98._M_impl.super__Rb_tree_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
  ::_M_insert_unique<uint256_const&>
            ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
              *)&local_68,tx_hash);
  if (local_68._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      local_b8._0_8_ = *(undefined8 *)(local_68._M_impl.super__Rb_tree_header._M_header._M_left + 1)
      ;
      local_b8._8_8_ = local_68._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      local_a8 = local_68._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left;
      p_Stack_a0 = local_68._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_right;
      pVar8 = std::
              _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
              ::equal_range(&local_68,(key_type *)local_b8);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::_M_erase_aux(&local_68,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
      std::
      _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
      _M_insert_unique<uint256_const&>
                ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                  *)&local_98,(key_type *)local_b8);
      iVar3 = _GLOBAL__N_1::std::
              _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&this->mapWallet,(key_type *)local_b8);
      if (iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
          == (__node_type *)0x0) {
LAB_00538890:
        __assert_fail("it != mapWallet.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x56f,
                      "void wallet::CWallet::RecursiveUpdateTxState(WalletBatch *, const uint256 &, const TryUpdatingStateFn &)"
                     );
      }
      if ((try_updating_state->super__Function_base)._M_manager == (_Manager_type)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
          std::__throw_bad_function_call();
          goto LAB_00538890;
        }
        goto LAB_0053890f;
      }
      TVar2 = (*try_updating_state->_M_invoker)
                        ((_Any_data *)try_updating_state,
                         (CWalletTx *)
                         ((long)iVar3.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
      if (TVar2 != UNCHANGED) {
        *(undefined8 *)
         ((long)iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x90) = 0;
        *(undefined8 *)
         ((long)iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0xd8) = 0;
        *(undefined8 *)
         ((long)iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x120) = 0;
        *(undefined8 *)
         ((long)iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x168) = 0;
        *(undefined2 *)
         ((long)iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur + 0x1b0) = 1;
        if (batch != (WalletBatch *)0x0) {
          WalletBatch::WriteTx
                    (batch,(CWalletTx *)
                           ((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x28));
        }
        if (*(long *)(*(long *)((long)iVar3.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x20) !=
            *(long *)(*(long *)((long)iVar3.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x18)) {
          uVar7 = 0;
          do {
            local_d8 = local_a8;
            p_Stack_d0 = p_Stack_a0;
            local_e8._0_8_ = local_b8._0_8_;
            local_e8._8_8_ = local_b8._8_8_;
            local_c8 = (uint32_t)uVar7;
            pVar9 = std::
                    _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                    ::equal_range(&(this->mapTxSpends)._M_h,(key_type *)local_e8);
            for (_Var4._M_cur = (__node_type *)
                                pVar9.first.
                                super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                                ._M_cur;
                (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var4._M_cur !=
                pVar9.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
                _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt) {
              __k = (key_type *)
                    ((long)&((_Var4._M_cur)->
                            super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                            super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                            _M_storage._M_storage + 0x24);
              cVar5 = std::
                      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                      ::find(&local_98,__k);
              if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
                std::
                _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                ::_M_insert_unique<uint256_const&>
                          ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                            *)&local_68,__k);
              }
            }
            uVar7 = (ulong)((uint32_t)uVar7 + 1);
            uVar6 = (*(long *)(*(long *)((long)iVar3.
                                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                               ._M_cur + 0x1c0) + 0x20) -
                     *(long *)(*(long *)((long)iVar3.
                                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                               ._M_cur + 0x1c0) + 0x18) >> 3) * -0x3333333333333333;
          } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
        }
        if (TVar2 == NOTIFY_CHANGED) {
          boost::signals2::
          signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
          ::operator()(&this->NotifyTransactionChanged,
                       (uint256 *)
                       (*(long *)((long)iVar3.
                                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                        ._M_cur + 0x1c0) + 0x39),CT_UPDATED);
        }
        MarkInputsDirty(this,(CTransactionRef *)
                             ((long)iVar3.
                                    super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                    ._M_cur + 0x1c0));
      }
    } while (local_68._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return;
  }
LAB_0053890f:
  __stack_chk_fail();
}

Assistant:

void CWallet::RecursiveUpdateTxState(WalletBatch* batch, const uint256& tx_hash, const TryUpdatingStateFn& try_updating_state) {
    std::set<uint256> todo;
    std::set<uint256> done;

    todo.insert(tx_hash);

    while (!todo.empty()) {
        uint256 now = *todo.begin();
        todo.erase(now);
        done.insert(now);
        auto it = mapWallet.find(now);
        assert(it != mapWallet.end());
        CWalletTx& wtx = it->second;

        TxUpdate update_state = try_updating_state(wtx);
        if (update_state != TxUpdate::UNCHANGED) {
            wtx.MarkDirty();
            if (batch) batch->WriteTx(wtx);
            // Iterate over all its outputs, and update those tx states as well (if applicable)
            for (unsigned int i = 0; i < wtx.tx->vout.size(); ++i) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(COutPoint(Txid::FromUint256(now), i));
                for (TxSpends::const_iterator iter = range.first; iter != range.second; ++iter) {
                    if (!done.count(iter->second)) {
                        todo.insert(iter->second);
                    }
                }
            }

            if (update_state == TxUpdate::NOTIFY_CHANGED) {
                NotifyTransactionChanged(wtx.GetHash(), CT_UPDATED);
            }

            // If a transaction changes its tx state, that usually changes the balance
            // available of the outputs it spends. So force those to be recomputed
            MarkInputsDirty(wtx.tx);
        }
    }
}